

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

char * __thiscall
CVmImageLoader::alloc_and_read(CVmImageLoader *this,size_t read_len,ulong *remaining_size)

{
  char *pcVar1;
  ulong *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  char *p;
  
  if (*in_RDX < in_RSI) {
    err_throw(0);
  }
  pcVar1 = (char *)(**(code **)(*(long *)*in_RDI + 0x20))((long *)*in_RDI,in_RSI,0,*in_RDX);
  *in_RDX = *in_RDX - in_RSI;
  return pcVar1;
}

Assistant:

const char *CVmImageLoader::alloc_and_read(size_t read_len,
                                           ulong *remaining_size)
{
    const char *p;
    
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* allocate space, and read the data into the new space */
    p = fp_->alloc_and_read(read_len, 0, *remaining_size);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* return the pointer to the new space */
    return p;
}